

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplace_back<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
           *this,pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  iterator ppVar1;
  undefined8 *in_RSI;
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
  *in_RDI;
  pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
  *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>::
    end(in_RDI);
    local_8 = emplaceRealloc<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    ppVar1 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
             ::end(in_RDI);
    ppVar1->first = (ValueSymbol *)*in_RSI;
    ppVar1->second = (Expression *)in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = SmallVectorBase<std::pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*>_>
              ::back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }